

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O1

bool __thiscall
Js::EquivalentTypeSet::Contains(EquivalentTypeSet *this,JITTypeHolder type,uint16 *pIndex)

{
  bool bVar1;
  uint16 uVar2;
  bool bVar3;
  JITTypeHolderBase<void> local_40;
  JITTypeHolder type_local;
  
  local_40.t = type.t;
  if (this->sortedAndDuplicatesRemoved == false) {
    SortAndRemoveDuplicates(this);
  }
  bVar3 = this->count != 0;
  if (bVar3) {
    uVar2 = 0;
    type_local = GetType(this,0);
    bVar1 = JITTypeHolderBase<void>::operator==(&type_local,&local_40);
    if (!bVar1) {
      uVar2 = 0;
      do {
        bVar3 = (ushort)(uVar2 + 1) < this->count;
        if (!bVar3) {
          return bVar3;
        }
        type_local = GetType(this,uVar2 + 1);
        bVar1 = JITTypeHolderBase<void>::operator==(&type_local,&local_40);
        uVar2 = uVar2 + 1;
      } while (!bVar1);
    }
    if (pIndex != (uint16 *)0x0) {
      *pIndex = uVar2;
    }
  }
  return bVar3;
}

Assistant:

bool EquivalentTypeSet::Contains(const JITTypeHolder type, uint16* pIndex)
{
    if (!this->GetSortedAndDuplicatesRemoved())
    {
        this->SortAndRemoveDuplicates();
    }
    for (uint16 ti = 0; ti < this->count; ti++)
    {
        if (this->GetType(ti) == type)
        {
            if (pIndex)
            {
                *pIndex = ti;
            }
            return true;
        }
    }
    return false;
}